

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>
::int_writer<unsigned_long,fmt::v5::basic_format_specs<char>>::bin_writer<1>::operator()
          (bin_writer<1> *this,
          back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> *it)

{
  back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> bVar1;
  undefined8 *in_RSI;
  bool in_stack_0000002b;
  int in_stack_0000002c;
  unsigned_long in_stack_00000030;
  back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> in_stack_00000038;
  
  bVar1 = internal::
          format_uint<1u,char,std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,unsigned_long>
                    (in_stack_00000038,in_stack_00000030,in_stack_0000002c,in_stack_0000002b);
  *in_RSI = bVar1.container;
  return;
}

Assistant:

void operator()(It &&it) const {
        it = internal::format_uint<BITS, char_type>(it, abs_value, num_digits);
      }